

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_self_test(int verbose)

{
  int iVar1;
  mbedtls_md_info_t *md_info_00;
  mbedtls_md_info_t *md_info;
  uchar buf [80];
  undefined1 local_90 [8];
  mbedtls_hmac_drbg_context ctx;
  int verbose_local;
  
  ctx.p_entropy._0_4_ = verbose;
  md_info_00 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  mbedtls_hmac_drbg_init((mbedtls_hmac_drbg_context *)local_90);
  if ((int)ctx.p_entropy != 0) {
    printf("  HMAC_DRBG (PR = True) : ");
  }
  test_offset = 0;
  iVar1 = mbedtls_hmac_drbg_seed
                    ((mbedtls_hmac_drbg_context *)local_90,md_info_00,hmac_drbg_self_test_entropy,
                     entropy_pr,(uchar *)0x0,0);
  if (iVar1 == 0) {
    mbedtls_hmac_drbg_set_prediction_resistance((mbedtls_hmac_drbg_context *)local_90,1);
    iVar1 = mbedtls_hmac_drbg_random(local_90,(uchar *)&md_info,0x50);
    if (iVar1 == 0) {
      iVar1 = mbedtls_hmac_drbg_random(local_90,(uchar *)&md_info,0x50);
      if (iVar1 == 0) {
        iVar1 = memcmp(&md_info,result_pr,0x50);
        if (iVar1 == 0) {
          mbedtls_hmac_drbg_free((mbedtls_hmac_drbg_context *)local_90);
          mbedtls_hmac_drbg_free((mbedtls_hmac_drbg_context *)local_90);
          if ((int)ctx.p_entropy != 0) {
            printf("passed\n");
          }
          if ((int)ctx.p_entropy != 0) {
            printf("  HMAC_DRBG (PR = False) : ");
          }
          mbedtls_hmac_drbg_init((mbedtls_hmac_drbg_context *)local_90);
          test_offset = 0;
          iVar1 = mbedtls_hmac_drbg_seed
                            ((mbedtls_hmac_drbg_context *)local_90,md_info_00,
                             hmac_drbg_self_test_entropy,entropy_nopr,(uchar *)0x0,0);
          if (iVar1 == 0) {
            iVar1 = mbedtls_hmac_drbg_reseed((mbedtls_hmac_drbg_context *)local_90,(uchar *)0x0,0);
            if (iVar1 == 0) {
              iVar1 = mbedtls_hmac_drbg_random(local_90,(uchar *)&md_info,0x50);
              if (iVar1 == 0) {
                iVar1 = mbedtls_hmac_drbg_random(local_90,(uchar *)&md_info,0x50);
                if (iVar1 == 0) {
                  iVar1 = memcmp(&md_info,result_nopr,0x50);
                  if (iVar1 == 0) {
                    mbedtls_hmac_drbg_free((mbedtls_hmac_drbg_context *)local_90);
                    mbedtls_hmac_drbg_free((mbedtls_hmac_drbg_context *)local_90);
                    if ((int)ctx.p_entropy != 0) {
                      printf("passed\n");
                    }
                    if ((int)ctx.p_entropy != 0) {
                      printf("\n");
                    }
                    ctx.p_entropy._4_4_ = 0;
                  }
                  else {
                    if ((int)ctx.p_entropy != 0) {
                      printf("failed\n");
                    }
                    ctx.p_entropy._4_4_ = 1;
                  }
                }
                else {
                  if ((int)ctx.p_entropy != 0) {
                    printf("failed\n");
                  }
                  ctx.p_entropy._4_4_ = 1;
                }
              }
              else {
                if ((int)ctx.p_entropy != 0) {
                  printf("failed\n");
                }
                ctx.p_entropy._4_4_ = 1;
              }
            }
            else {
              if ((int)ctx.p_entropy != 0) {
                printf("failed\n");
              }
              ctx.p_entropy._4_4_ = 1;
            }
          }
          else {
            if ((int)ctx.p_entropy != 0) {
              printf("failed\n");
            }
            ctx.p_entropy._4_4_ = 1;
          }
        }
        else {
          if ((int)ctx.p_entropy != 0) {
            printf("failed\n");
          }
          ctx.p_entropy._4_4_ = 1;
        }
      }
      else {
        if ((int)ctx.p_entropy != 0) {
          printf("failed\n");
        }
        ctx.p_entropy._4_4_ = 1;
      }
    }
    else {
      if ((int)ctx.p_entropy != 0) {
        printf("failed\n");
      }
      ctx.p_entropy._4_4_ = 1;
    }
  }
  else {
    if ((int)ctx.p_entropy != 0) {
      printf("failed\n");
    }
    ctx.p_entropy._4_4_ = 1;
  }
  return ctx.p_entropy._4_4_;
}

Assistant:

int mbedtls_hmac_drbg_self_test( int verbose )
{
    mbedtls_hmac_drbg_context ctx;
    unsigned char buf[OUTPUT_LEN];
    const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 );

    mbedtls_hmac_drbg_init( &ctx );

    /*
     * PR = True
     */
    if( verbose != 0 )
        mbedtls_printf( "  HMAC_DRBG (PR = True) : " );

    test_offset = 0;
    CHK( mbedtls_hmac_drbg_seed( &ctx, md_info,
                         hmac_drbg_self_test_entropy, (void *) entropy_pr,
                         NULL, 0 ) );
    mbedtls_hmac_drbg_set_prediction_resistance( &ctx, MBEDTLS_HMAC_DRBG_PR_ON );
    CHK( mbedtls_hmac_drbg_random( &ctx, buf, OUTPUT_LEN ) );
    CHK( mbedtls_hmac_drbg_random( &ctx, buf, OUTPUT_LEN ) );
    CHK( memcmp( buf, result_pr, OUTPUT_LEN ) );
    mbedtls_hmac_drbg_free( &ctx );

    mbedtls_hmac_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    /*
     * PR = False
     */
    if( verbose != 0 )
        mbedtls_printf( "  HMAC_DRBG (PR = False) : " );

    mbedtls_hmac_drbg_init( &ctx );

    test_offset = 0;
    CHK( mbedtls_hmac_drbg_seed( &ctx, md_info,
                         hmac_drbg_self_test_entropy, (void *) entropy_nopr,
                         NULL, 0 ) );
    CHK( mbedtls_hmac_drbg_reseed( &ctx, NULL, 0 ) );
    CHK( mbedtls_hmac_drbg_random( &ctx, buf, OUTPUT_LEN ) );
    CHK( mbedtls_hmac_drbg_random( &ctx, buf, OUTPUT_LEN ) );
    CHK( memcmp( buf, result_nopr, OUTPUT_LEN ) );
    mbedtls_hmac_drbg_free( &ctx );

    mbedtls_hmac_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}